

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O3

void __thiscall summarycalc::reset_sse_array(summarycalc *this)

{
  int iVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((this->fout[lVar2] != (FILE *)0x0) &&
       (iVar1 = this->max_summary_id_[lVar2] - this->min_summary_id_[lVar2], -1 < iVar1 + 1)) {
      memset(this->sse[lVar2],0,(ulong)(iVar1 + 2) << 2);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  return;
}

Assistant:

void summarycalc::reset_sse_array()
{
	for (int i = 0; i < MAX_SUMMARY_SETS; i++) {
		if (fout[i] != nullptr) {
			OASIS_FLOAT *se = sse[i];		// f array of se[summary_id] to exposure
			int maxsummaryids = max_summary_id_[i] - min_summary_id_[i] + 1;
			for (int j = 0; j <= maxsummaryids; j++) {
				se[j] = 0;
			}
		}
	}
}